

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffbinit(fitsfile *fptr,int *status)

{
  long lVar1;
  long lVar2;
  int iVar3;
  int *in_RSI;
  int *in_RDI;
  char message [81];
  char comm [73];
  char value [71];
  char name [75];
  tcolumn *colptr;
  LONGLONG totalwidth;
  LONGLONG nrows;
  LONGLONG rowlen;
  LONGLONG pcount;
  long tfield;
  int ntilebins;
  int nspace;
  int ii;
  long *in_stack_fffffffffffffe48;
  LONGLONG *in_stack_fffffffffffffe50;
  LONGLONG *in_stack_fffffffffffffe58;
  LONGLONG *in_stack_fffffffffffffe60;
  fitsfile *in_stack_fffffffffffffe68;
  int *in_stack_fffffffffffffe70;
  char *in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe84;
  char *in_stack_fffffffffffffe88;
  int *in_stack_fffffffffffffeb0;
  char in_stack_fffffffffffffeb8;
  undefined7 in_stack_fffffffffffffeb9;
  int in_stack_fffffffffffffec4;
  fitsfile *in_stack_fffffffffffffec8;
  LONGLONG *in_stack_fffffffffffffed0;
  fitsfile *in_stack_fffffffffffffed8;
  char local_f8 [8];
  int *in_stack_ffffffffffffff10;
  fitsfile *in_stack_ffffffffffffff18;
  char *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff34;
  fitsfile *in_stack_ffffffffffffff38;
  int *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  char *in_stack_ffffffffffffff50;
  char in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff59;
  undefined1 *local_58;
  long local_50;
  long local_48;
  long local_40;
  undefined8 local_38;
  size_t local_30;
  int local_20;
  int local_1c;
  
  local_58 = (undefined1 *)0x0;
  if (0 < *in_RSI) {
    return *in_RSI;
  }
  if (*in_RDI != *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
    ffmahd(in_stack_fffffffffffffec8,in_stack_fffffffffffffec4,
           (int *)CONCAT71(in_stack_fffffffffffffeb9,in_stack_fffffffffffffeb8),
           in_stack_fffffffffffffeb0);
  }
  *(undefined4 *)(*(long *)(in_RDI + 2) + 0x58) = 2;
  *(undefined8 *)(*(long *)(in_RDI + 2) + 0x70) = *(undefined8 *)(*(long *)(in_RDI + 2) + 0x30);
  iVar3 = ffgttb(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                 in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,(int *)0x16ceef);
  if (0 < iVar3) {
    return *in_RSI;
  }
  *(long *)(*(long *)(in_RDI + 2) + 0x3c8) = local_40;
  *(int *)(*(long *)(in_RDI + 2) + 0x3b0) = (int)local_30;
  if (*(long *)(*(long *)(in_RDI + 2) + 0x530) != 0) {
    lVar1 = *(long *)(*(long *)(in_RDI + 2) + 0x498);
    lVar2 = *(long *)(*(long *)(in_RDI + 2) + 0x440);
    for (local_1c = 0; local_1c < (int)((lVar1 + -1) / lVar2) + 1; local_1c = local_1c + 1) {
      if (*(long *)(*(long *)(*(long *)(in_RDI + 2) + 0x548) + (long)local_1c * 8) != 0) {
        free(*(void **)(*(long *)(*(long *)(in_RDI + 2) + 0x548) + (long)local_1c * 8));
      }
      if (*(long *)(*(long *)(*(long *)(in_RDI + 2) + 0x550) + (long)local_1c * 8) != 0) {
        free(*(void **)(*(long *)(*(long *)(in_RDI + 2) + 0x550) + (long)local_1c * 8));
      }
    }
    free(*(void **)(*(long *)(in_RDI + 2) + 0x558));
    free(*(void **)(*(long *)(in_RDI + 2) + 0x540));
    free(*(void **)(*(long *)(in_RDI + 2) + 0x538));
    free(*(void **)(*(long *)(in_RDI + 2) + 0x550));
    free(*(void **)(*(long *)(in_RDI + 2) + 0x548));
    free(*(void **)(*(long *)(in_RDI + 2) + 0x530));
    *(undefined8 *)(*(long *)(in_RDI + 2) + 0x558) = 0;
    *(undefined8 *)(*(long *)(in_RDI + 2) + 0x540) = 0;
    *(undefined8 *)(*(long *)(in_RDI + 2) + 0x538) = 0;
    *(undefined8 *)(*(long *)(in_RDI + 2) + 0x550) = 0;
    *(undefined8 *)(*(long *)(in_RDI + 2) + 0x548) = 0;
    *(undefined8 *)(*(long *)(in_RDI + 2) + 0x530) = 0;
  }
  if (*(long *)(*(long *)(in_RDI + 2) + 0x3d0) != 0) {
    free(*(void **)(*(long *)(in_RDI + 2) + 0x3d0));
  }
  if ((0 < (long)local_30) &&
     (local_58 = (undefined1 *)calloc(local_30,0xa0), local_58 == (undefined1 *)0x0)) {
    ffpmsg((char *)0x16d1d9);
    *(undefined8 *)(*(long *)(in_RDI + 2) + 0x3d0) = 0;
    *in_RSI = 0x6f;
    return 0x6f;
  }
  *(undefined1 **)(*(long *)(in_RDI + 2) + 0x3d0) = local_58;
  for (local_1c = 0; (long)local_1c < (long)local_30; local_1c = local_1c + 1) {
    *local_58 = 0;
    *(undefined8 *)(local_58 + 0x60) = 0x3ff0000000000000;
    *(undefined8 *)(local_58 + 0x68) = 0;
    *(undefined8 *)(local_58 + 0x70) = 0x4995cdd1;
    *(undefined4 *)(local_58 + 0x50) = 0xffffd8f1;
    *(undefined8 *)(local_58 + 0x58) = 1;
    local_58[0x78] = 0;
    local_58 = local_58 + 0xa0;
  }
  *(long *)(*(long *)(in_RDI + 2) + 0x3c0) = local_48;
  *(long *)(*(long *)(in_RDI + 2) + 0x3b8) = local_48;
  *(long *)(*(long *)(in_RDI + 2) + 0x3d8) = local_40 * local_48;
  *(undefined8 *)(*(long *)(in_RDI + 2) + 0x3e0) = local_38;
  *(undefined4 *)(*(long *)(in_RDI + 2) + 0x47c) = 0;
  local_20 = 0;
  while( true ) {
    ffgkyn(in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,in_stack_ffffffffffffff28,
           in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    if (*in_RSI == 0xcd) {
      strcat(local_f8,"\'");
      *in_RSI = 0;
    }
    else if (*in_RSI == 0xcf) {
      *in_RSI = 0;
    }
    if (*in_RSI == 0x6b) break;
    if (0 < *in_RSI) {
      return *in_RSI;
    }
    if (in_stack_ffffffffffffff58 == 'T') {
      ffgtbp((fitsfile *)CONCAT71(in_stack_ffffffffffffff59,0x54),in_stack_ffffffffffffff50,
             in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    }
    else if (((in_stack_ffffffffffffff58 < 'Z') || ('Z' < in_stack_ffffffffffffff58)) ||
            (iVar3 = strcmp(&stack0xffffffffffffff58,"ZIMAGE"), iVar3 != 0)) {
      if ((('D' < in_stack_ffffffffffffff58) && (in_stack_ffffffffffffff58 < 'F')) &&
         (iVar3 = strcmp(&stack0xffffffffffffff58,"END"), iVar3 == 0)) {
        local_58 = *(undefined1 **)(*(long *)(in_RDI + 2) + 0x3d0);
        local_1c = 0;
        while( true ) {
          if ((long)local_30 <= (long)local_1c) {
            *(long *)(*(long *)(in_RDI + 2) + 0x70) =
                 *(long *)(*(long *)(in_RDI + 2) + 0x80) - (long)((local_20 + 1) * 0x50);
            *(long *)(*(long *)(in_RDI + 2) + 0x88) =
                 ((*(long *)(*(long *)(in_RDI + 2) + 0x80) + -0x50) / 0xb40 + 1) * 0xb40;
            *(long *)(*(long *)(*(long *)(in_RDI + 2) + 0x68) +
                     (long)(*(int *)(*(long *)(in_RDI + 2) + 0x54) + 1) * 8) =
                 *(long *)(*(long *)(in_RDI + 2) + 0x88) +
                 ((*(long *)(*(long *)(in_RDI + 2) + 0x3d8) +
                   *(long *)(*(long *)(in_RDI + 2) + 0x3e0) + 0xb3f) / 0xb40) * 0xb40;
            ffgtbc(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                   &in_stack_fffffffffffffec8->HDUposition);
            if (local_50 != local_40) {
              snprintf(&stack0xfffffffffffffe58,0x51,
                       "NAXIS1 = %ld is not equal to the sum of column widths: %ld",local_40,
                       local_50);
              ffpmsg((char *)0x16d807);
              *in_RSI = 0xf1;
            }
            *(undefined8 *)(*(long *)(in_RDI + 2) + 0x80) =
                 *(undefined8 *)
                  (*(long *)(*(long *)(in_RDI + 2) + 0x68) +
                  (long)*(int *)(*(long *)(in_RDI + 2) + 0x54) * 8);
            if (*(int *)(*(long *)(in_RDI + 2) + 0x47c) == 1) {
              imcomp_get_compressed_image_par(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
            }
            return *in_RSI;
          }
          if (*(int *)((long)local_58 + 0x50) == -9999) break;
          local_1c = local_1c + 1;
          local_58 = (undefined1 *)((long)local_58 + 0xa0);
        }
        ffkeyn(in_stack_fffffffffffffe88,in_stack_fffffffffffffe84,in_stack_fffffffffffffe78,
               in_stack_fffffffffffffe70);
        snprintf(&stack0xfffffffffffffe58,0x51,"Required %s keyword not found (ffbinit).",
                 &stack0xffffffffffffff58);
        ffpmsg((char *)0x16d660);
        *in_RSI = 0xe8;
        return 0xe8;
      }
    }
    else if (local_f8[0] == 'T') {
      *(undefined4 *)(*(long *)(in_RDI + 2) + 0x47c) = 1;
    }
    if (((in_stack_ffffffffffffff58 == '\0') && (local_f8[0] == '\0')) &&
       (in_stack_fffffffffffffeb8 == '\0')) {
      local_20 = local_20 + 1;
    }
    else {
      local_20 = 0;
    }
  }
  ffpmsg((char *)0x16d42d);
  *in_RSI = 0xd2;
  return 0xd2;
}

Assistant:

int ffbinit(fitsfile *fptr,     /* I - FITS file pointer */
            int *status)        /* IO - error status     */
{
/*
  initialize the parameters defining the structure of a binary table 
*/
    int  ii, nspace, ntilebins;
    long tfield;
    LONGLONG pcount, rowlen, nrows, totalwidth;
    tcolumn *colptr = 0;
    char name[FLEN_KEYWORD], value[FLEN_VALUE], comm[FLEN_COMMENT];
    char message[FLEN_ERRMSG];

    if (*status > 0)
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    (fptr->Fptr)->hdutype = BINARY_TBL;  /* set that this is a binary table */
    (fptr->Fptr)->headend = (fptr->Fptr)->logfilesize;  /* set max size */

    /* get table parameters and test that the header is valid: */
    if (ffgttb(fptr, &rowlen, &nrows, &pcount, &tfield, status) > 0)
       return(*status);

    (fptr->Fptr)->rowlength =  rowlen; /* store length of a row */
    (fptr->Fptr)->tfield = tfield; /* store number of table fields in row */

     /* free the tile-compressed image cache, if it exists */
     if ((fptr->Fptr)->tilerow) {

           ntilebins = 
	    (((fptr->Fptr)->znaxis[0] - 1) / ((fptr->Fptr)->tilesize[0])) + 1;

           for (ii = 0; ii < ntilebins; ii++) {
             if ((fptr->Fptr)->tiledata[ii]) {
	       free((fptr->Fptr)->tiledata[ii]);
             }

             if ((fptr->Fptr)->tilenullarray[ii]) {
	       free((fptr->Fptr)->tilenullarray[ii]);
             }
            }
	    
	    free((fptr->Fptr)->tileanynull);
	    free((fptr->Fptr)->tiletype);	   
	    free((fptr->Fptr)->tiledatasize);
	    free((fptr->Fptr)->tilenullarray);
	    free((fptr->Fptr)->tiledata);
	    free((fptr->Fptr)->tilerow);

	    (fptr->Fptr)->tileanynull = 0;
	    (fptr->Fptr)->tiletype = 0;	   
	    (fptr->Fptr)->tiledatasize = 0;
	    (fptr->Fptr)->tilenullarray = 0;
	    (fptr->Fptr)->tiledata = 0;
	    (fptr->Fptr)->tilerow = 0;
     }

    if ((fptr->Fptr)->tableptr)
       free((fptr->Fptr)->tableptr); /* free memory for the old CHDU */

    /* mem for column structures ; space is initialized = 0  */
    if (tfield > 0)
    {
      colptr = (tcolumn *) calloc(tfield, sizeof(tcolumn) );
      if (!colptr)
      {
        ffpmsg
        ("malloc failed to get memory for FITS table descriptors (ffbinit)");
        (fptr->Fptr)->tableptr = 0;  /* set a null table structure pointer */
        return(*status = ARRAY_TOO_BIG);
      }
    }

    /* copy the table structure address to the fitsfile structure */
    (fptr->Fptr)->tableptr = colptr; 

    /* initialize the table field parameters */
    for (ii = 0; ii < tfield; ii++, colptr++)
    {
        colptr->ttype[0] = '\0';  /* null column name */
        colptr->tscale = 1.;
        colptr->tzero  = 0.;
        colptr->tnull  = NULL_UNDEFINED; /* (integer) null value undefined */
        colptr->tdatatype = -9999;   /* initialize to illegal value */
        colptr->trepeat = 1;
        colptr->strnull[0] = '\0'; /* for ASCII string columns (TFORM = rA) */
    }

    /*
      Initialize the heap starting address (immediately following
      the table data) and the size of the heap.  This is used to find the
      end of the table data when checking the fill values in the last block. 
    */
    (fptr->Fptr)->numrows = nrows;
    (fptr->Fptr)->origrows = nrows;
    (fptr->Fptr)->heapstart = rowlen * nrows;
    (fptr->Fptr)->heapsize = pcount;

    (fptr->Fptr)->compressimg = 0;  /* initialize as not a compressed image */

    /* now search for the table column keywords and the END keyword */

    for (nspace = 0, ii = 8; 1; ii++)  /* infinite loop  */
    {
        ffgkyn(fptr, ii, name, value, comm, status);

        /* try to ignore minor syntax errors */
        if (*status == NO_QUOTE)
        {
            strcat(value, "'");
            *status = 0;
        }
        else if (*status == BAD_KEYCHAR)
        {
            *status = 0;
        }

        if (*status == END_OF_FILE)
        {
            ffpmsg("END keyword not found in binary table header (ffbinit).");
            return(*status = NO_END);
        }
        else if (*status > 0)
            return(*status);

        else if (name[0] == 'T')   /* keyword starts with 'T' ? */
            ffgtbp(fptr, name, value, status); /* test if column keyword */

        else if (!FSTRCMP(name, "ZIMAGE"))
        {
            if (value[0] == 'T')
                (fptr->Fptr)->compressimg = 1; /* this is a compressed image */
        }
        else if (!FSTRCMP(name, "END"))  /* is this the END keyword? */
            break;


        if (!name[0] && !value[0] && !comm[0])  /* a blank keyword? */
            nspace++;

        else
            nspace = 0; /* reset number of consecutive spaces before END */
    }

    /* test that all the required keywords were found and have legal values */
    colptr = (fptr->Fptr)->tableptr;  /* set pointer to first column */

    for (ii = 0; ii < tfield; ii++, colptr++)
    {
        if (colptr->tdatatype == -9999)
        {
            ffkeyn("TFORM", ii+1, name, status);  /* construct keyword name */
            snprintf(message,FLEN_ERRMSG,"Required %s keyword not found (ffbinit).", name);
            ffpmsg(message);
            return(*status = NO_TFORM);
        }
    }

    /*
      now we know everything about the table; just fill in the parameters:
      the 'END' record is 80 bytes before the current position, minus
      any trailing blank keywords just before the END keyword.
    */

    (fptr->Fptr)->headend = (fptr->Fptr)->nextkey - (80 * (nspace + 1));
 
    /* the data unit begins at the beginning of the next logical block */
    (fptr->Fptr)->datastart = (((fptr->Fptr)->nextkey - 80) / 2880 + 1) 
                              * 2880;

    /* the next HDU begins in the next logical block after the data  */
    (fptr->Fptr)->headstart[ (fptr->Fptr)->curhdu + 1] = 
         (fptr->Fptr)->datastart +
	 ( ((fptr->Fptr)->heapstart + (fptr->Fptr)->heapsize + 2879) / 2880 * 2880 );

    /* determine the byte offset to the beginning of each column */
    ffgtbc(fptr, &totalwidth, status);

    if (totalwidth != rowlen)
    {
        snprintf(message,FLEN_ERRMSG,
        "NAXIS1 = %ld is not equal to the sum of column widths: %ld", 
        (long) rowlen, (long) totalwidth);
        ffpmsg(message);
        *status = BAD_ROW_WIDTH;
    }

    /* reset next keyword pointer to the start of the header */
    (fptr->Fptr)->nextkey = (fptr->Fptr)->headstart[ (fptr->Fptr)->curhdu ];

    if ( (fptr->Fptr)->compressimg == 1) /*  Is this a compressed image */
        imcomp_get_compressed_image_par(fptr, status);

    return(*status);
}